

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc_test.c
# Opt level: O0

int firstpass(etdc_table **table,uint *input,int size)

{
  int iVar1;
  long lVar2;
  int in_EDX;
  undefined8 *in_RDI;
  double dVar3;
  uint in_stack_0000000c;
  int i;
  etdc_table **in_stack_00000050;
  int local_18;
  
  startTimer();
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    etdc_add((etdc_table **)CONCAT44(size,i),in_stack_0000000c);
  }
  startTimer();
  etdc_sort(in_stack_00000050);
  startTimer();
  etdc_gencodes((etdc_table *)*in_RDI);
  dVar3 = timeFromBegin();
  lVar2 = realTimeFromBegin();
  printf("generating = %lf (%ld) \n",dVar3,lVar2);
  iVar1 = etdc_size((etdc_table *)*in_RDI);
  return iVar1;
}

Assistant:

int firstpass(struct etdc_table **table, unsigned int *input, int size) {
  int i;

  //adding symbols to hash table

  startTimer();
  for(i = 0; i < size; i++) {
    etdc_add(table, input[i]);
  }
  //printf("add hashtable time = %lf (%ld) \n", timeFromBegin(), realTimeFromBegin());

  //sorting by frequency (high values first)

  startTimer();
  etdc_sort(table);
  //printf("sorting hashtable time = %lf (%ld) \n", timeFromBegin(), realTimeFromBegin());

  //generate codes
  startTimer();
  etdc_gencodes(*table);
  printf("generating = %lf (%ld) \n", timeFromBegin(), realTimeFromBegin());

  return etdc_size(*table);
}